

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqPubSub.cpp
# Opt level: O0

void __thiscall
adios2::zmq::ZmqPubSub::OpenSubscriber(ZmqPubSub *this,string *address,size_t bufferSize)

{
  long lVar1;
  size_type sVar2;
  undefined8 uVar3;
  string *in_RDI;
  int error;
  size_type __new_size;
  allocator *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdd0;
  allocator *paVar4;
  int commRank;
  string *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [32];
  int local_168;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  undefined1 local_99 [40];
  undefined1 local_71 [56];
  undefined1 local_39 [57];
  
  commRank = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  lVar1 = zmq_ctx_new();
  *(long *)in_RDI = lVar1;
  if (*(long *)in_RDI == 0) {
    in_stack_fffffffffffffde8 = (string *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_39 + 1),"Toolkit",(allocator *)in_stack_fffffffffffffde8);
    in_stack_fffffffffffffde0 = (string *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_71 + 1),"ZmqPubSub",(allocator *)in_stack_fffffffffffffde0);
    in_stack_fffffffffffffdd8 = (string *)local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_99 + 1),"OpenSubscriber",(allocator *)in_stack_fffffffffffffdd8);
    paVar4 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"creating zmq context failed",paVar4);
    commRank = (int)((ulong)paVar4 >> 0x20);
    helper::Throw<std::runtime_error>
              (in_RDI,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               commRank);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    std::__cxx11::string::~string((string *)(local_39 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  sVar2 = zmq_socket(*(long *)in_RDI,2);
  in_RDI->_M_string_length = sVar2;
  if (in_RDI->_M_string_length == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Toolkit",&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"ZmqPubSub",&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"OpenSubscriber",&local_139);
    in_stack_fffffffffffffdb0 = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"creating zmq socket failed",in_stack_fffffffffffffdb0);
    helper::Throw<std::runtime_error>
              (in_RDI,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               commRank);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  __new_size = in_RDI->_M_string_length;
  uVar3 = std::__cxx11::string::c_str();
  local_168 = zmq_connect(__new_size,uVar3);
  if (local_168 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"Toolkit",&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"ZmqPubSub",&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"OpenSubscriber",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"connecting zmq socket failed",&local_201);
    helper::Throw<std::runtime_error>
              (in_RDI,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               commRank);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  zmq_setsockopt(in_RDI->_M_string_length,6,"",0);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdb0,__new_size);
  return;
}

Assistant:

void ZmqPubSub::OpenSubscriber(const std::string &address, const size_t bufferSize)
{
    m_ZmqContext = zmq_ctx_new();
    if (not m_ZmqContext)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqPubSub", "OpenSubscriber",
                                          "creating zmq context failed");
    }

    m_ZmqSocket = zmq_socket(m_ZmqContext, ZMQ_SUB);
    if (not m_ZmqSocket)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqPubSub", "OpenSubscriber",
                                          "creating zmq socket failed");
    }

    int error = zmq_connect(m_ZmqSocket, address.c_str());
    if (error)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqPubSub", "OpenSubscriber",
                                          "connecting zmq socket failed");
    }

    zmq_setsockopt(m_ZmqSocket, ZMQ_SUBSCRIBE, "", 0);

    m_ReceiverBuffer.resize(bufferSize);
}